

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback_queue.cpp
# Opt level: O0

void __thiscall miniros::CallbackQueue::disable(CallbackQueue *this)

{
  mutex_type *in_RDI;
  scoped_lock<std::mutex> lock;
  scoped_lock<std::mutex> *in_stack_fffffffffffffff0;
  
  std::scoped_lock<std::mutex>::scoped_lock(in_stack_fffffffffffffff0,in_RDI);
  in_RDI[9].super___mutex_base._M_mutex.__size[0] = '\0';
  std::condition_variable::notify_all();
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x41f8f1);
  return;
}

Assistant:

void CallbackQueue::disable()
{
  std::scoped_lock<std::mutex> lock(mutex_);
  enabled_ = false;

  condition_.notify_all();
}